

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutex.cc
# Opt level: O0

void __thiscall absl::Mutex::~Mutex(Mutex *this)

{
  bool bVar1;
  intptr_t v;
  Mutex *this_local;
  memory_order __b;
  
  std::operator&(memory_order_relaxed,__memory_order_mask);
  if ((((this->mu_).super___atomic_base<long>._M_i & 0x10U) != 0) &&
     (bVar1 = DebugOnlyIsExiting(), !bVar1)) {
    ForgetSynchEvent(&this->mu_,0x10,0x40);
  }
  ForgetDeadlockInfo(this);
  return;
}

Assistant:

Mutex::~Mutex() {
  intptr_t v = mu_.load(std::memory_order_relaxed);
  if ((v & kMuEvent) != 0 && !DebugOnlyIsExiting()) {
    ForgetSynchEvent(&this->mu_, kMuEvent, kMuSpin);
  }
  if (kDebugMode) {
    this->ForgetDeadlockInfo();
  }
  ABSL_TSAN_MUTEX_DESTROY(this, __tsan_mutex_not_static);
}